

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashFunction.h
# Opt level: O0

void __thiscall bwtil::HashFunction::quickSort(HashFunction *this,ulint *arr,uint n)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint in_EDX;
  HashFunction *in_RSI;
  bool bVar4;
  uint j;
  uint i;
  ulint t;
  ulint pivot;
  uint local_30;
  uint local_2c;
  uint n_00;
  undefined4 in_stack_ffffffffffffffe8;
  HashFunction *this_00;
  
  if (1 < in_EDX) {
    this_00 = in_RSI;
    uVar3 = rand();
    uVar1 = *(ulong *)(&in_RSI->base + ((ulong)uVar3 % (ulong)in_EDX) * 2);
    local_2c = 0;
    while( true ) {
      bVar4 = false;
      if (local_2c < in_EDX) {
        bVar4 = *(ulong *)(&this_00->base + (ulong)local_2c * 2) < uVar1;
      }
      if (!bVar4) break;
      local_2c = local_2c + 1;
    }
    local_30 = local_2c;
    while (local_30 < in_EDX) {
      while( true ) {
        bVar4 = false;
        if (local_30 < in_EDX) {
          bVar4 = uVar1 <= *(ulong *)(&this_00->base + (ulong)local_30 * 2);
        }
        if (!bVar4) break;
        local_30 = local_30 + 1;
      }
      if (local_30 < in_EDX) {
        uVar2 = *(undefined8 *)(&this_00->base + (ulong)local_2c * 2);
        *(undefined8 *)(&this_00->base + (ulong)local_2c * 2) =
             *(undefined8 *)(&this_00->base + (ulong)local_30 * 2);
        *(undefined8 *)(&this_00->base + (ulong)local_30 * 2) = uVar2;
        local_2c = local_2c + 1;
      }
    }
    if (local_2c == 0) {
      local_30 = 0;
      while (*(ulong *)(&this_00->base + (ulong)local_30 * 2) != uVar1) {
        local_30 = local_30 + 1;
      }
      uVar2 = *(undefined8 *)this_00;
      *(undefined8 *)this_00 = *(undefined8 *)(&this_00->base + (ulong)local_30 * 2);
      *(undefined8 *)(&this_00->base + (ulong)local_30 * 2) = uVar2;
    }
    n_00 = (uint)(uVar1 >> 0x20);
    quickSort(this_00,(ulint *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),n_00);
    quickSort(this_00,(ulint *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),n_00);
  }
  return;
}

Assistant:

void quickSort(ulint *arr, uint n) {

		if(n<2) return;

		ulint pivot = arr[rand()%(n)];
		ulint t;
		uint i=0,j=0;

		while(i<n && arr[i]<pivot)
			i++;

		j=i;

		//invariant: arr[0,...,i-1]<pivot; arr[i,...,j]>=pivot
		while (j<n) {

			while(j<n && (arr[j]>=pivot))
				j++;

			if(j<n){//swap arr[i] and arr[j]
				t = arr[i];
				arr[i] = arr[j];
				arr[j] = t;
				i++;
			}

		}

		if(i==0){//pivot is the minimum element: avoid loop

			j=0;
			while(arr[j]!=pivot)
				j++;

			t = arr[i];
			arr[i] = arr[j];
			arr[j] = t;

			i++;
		}

		quickSort(arr,i);
		quickSort(arr+i,n-i);

	}